

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_guarded_opt.hpp
# Opt level: O0

shared_handle * __thiscall
gmlc::libguarded::
shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
::lock(shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
       *this)

{
  shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  *in_RSI;
  pointer in_RDI;
  pointer in_stack_ffffffffffffffa8;
  pointer val;
  shared_lock<std::shared_mutex> local_20 [2];
  
  if (((ulong)in_RSI[0xb].data & 1) == 0) {
    val = in_RDI;
    std::shared_lock<std::shared_mutex>::shared_lock(local_20);
    shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
    ::shared_lock_handle(in_RSI,val,(lock_type *)in_RDI);
    std::shared_lock<std::shared_mutex>::~shared_lock((shared_lock<std::shared_mutex> *)in_RDI);
  }
  else {
    shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
    ::shared_lock_handle
              ((shared_lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
                *)in_RDI,in_stack_ffffffffffffffa8,(shared_mutex *)0x27b1dd);
    val = in_RDI;
  }
  return (shared_handle *)val;
}

Assistant:

auto shared_guarded_opt<T, M>::lock() const -> shared_handle
{
    return (enabled) ?
        shared_handle(&m_obj, m_mutex) :
        shared_handle(&m_obj, typename shared_locker<M>::locker_type{});
}